

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

void __thiscall
Component_setAndUnsetName_Test::~Component_setAndUnsetName_Test
          (Component_setAndUnsetName_Test *this)

{
  Component_setAndUnsetName_Test *this_local;
  
  ~Component_setAndUnsetName_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Component, setAndUnsetName)
{
    const std::string in = "name";
    const std::string eName =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"name\"/>\n"
        "</model>\n";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component/>\n"
        "</model>\n";
    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    c->setName(in);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a = printer->printModel(m);
    EXPECT_EQ("name", c->name());
    EXPECT_EQ(eName, a);
    c->setName("");
    EXPECT_EQ("", c->name());
    a = printer->printModel(m);
    EXPECT_EQ(e, a);
}